

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O3

QString * __thiscall
QAccessibleMenu::text(QString *__return_storage_ptr__,QAccessibleMenu *this,Text t)

{
  QWidget *this_00;
  long in_FS_OFFSET;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QAccessibleWidget::text(&local_48,&this->super_QAccessibleWidget,t);
  if ((undefined1 *)local_48.d.size == (undefined1 *)0x0) {
    if (t == Name) {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      this_00 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      QWidget::windowTitle(__return_storage_ptr__,this_00);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      (__return_storage_ptr__->d).d = local_48.d.d;
      (__return_storage_ptr__->d).ptr = local_48.d.ptr;
      (__return_storage_ptr__->d).size = 0;
    }
  }
  else {
    (__return_storage_ptr__->d).d = local_48.d.d;
    (__return_storage_ptr__->d).ptr = local_48.d.ptr;
    (__return_storage_ptr__->d).size = local_48.d.size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleMenu::text(QAccessible::Text t) const
{
    QString tx = QAccessibleWidget::text(t);
    if (!tx.isEmpty())
        return tx;

    if (t == QAccessible::Name)
        return menu()->windowTitle();
    return tx;
}